

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Vector4f __thiscall Matrix4f::getCol(Matrix4f *this,int j)

{
  float fy;
  int in_EDX;
  undefined4 in_register_00000034;
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Vector4f VVar2;
  
  fy = *(float *)(CONCAT44(in_register_00000034,j) + (long)(in_EDX * 4 + 1) * 4);
  uVar1 = (ulong)(uint)fy;
  Vector4f::Vector4f((Vector4f *)this,
                     *(float *)(CONCAT44(in_register_00000034,j) + (long)(in_EDX * 4) * 4),fy,
                     *(float *)(CONCAT44(in_register_00000034,j) + (long)(in_EDX * 4 + 2) * 4),
                     *(float *)(CONCAT44(in_register_00000034,j) + (long)(in_EDX * 4 + 3) * 4));
  VVar2.m_elements[2] = (float)(int)uVar1;
  VVar2.m_elements[3] = (float)(int)(uVar1 >> 0x20);
  VVar2.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector4f)VVar2.m_elements;
}

Assistant:

Vector4f Matrix4f::getCol( int j ) const
{
	int colStart = 4 * j;

	return Vector4f
	(
		m_elements[ colStart ],
		m_elements[ colStart + 1 ],
		m_elements[ colStart + 2 ],
		m_elements[ colStart + 3 ]
	);
}